

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O1

Var Js::JavascriptArray::FindHelper<false,true>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              int64 length,Arguments *args,ScriptContext *scriptContext)

{
  RecyclableObject *pRVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  BOOL BVar7;
  int iVar8;
  Var pvVar9;
  RecyclableObject *callBackFn;
  undefined4 *puVar10;
  uint64 uVar11;
  uint64 uVar12;
  JavascriptMethod p_Var13;
  undefined4 extraout_var;
  char16_t *varName;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined1 local_98 [8];
  JsReentLock jsReentLock;
  RecyclableObject *local_70;
  RecyclableObject *local_58;
  Var element;
  TypedArrayBase *local_48;
  ScriptContext *local_40;
  byte local_31;
  
  local_98 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_98)->noJsReentrancy;
  ((ThreadContext *)local_98)->noJsReentrancy = true;
  element = obj;
  local_48 = typedArrayBase;
  local_40 = scriptContext;
  JsReentLock::setObjectForMutation((JsReentLock *)local_98,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
LAB_00ba6f7b:
    varName = L"[TypedArray].prototype.find";
    if (local_48 == (TypedArrayBase *)0x0) {
      varName = L"Array.prototype.find";
    }
    JavascriptError::ThrowTypeError(local_40,-0x7ff5ec34,varName);
  }
  pvVar9 = Arguments::operator[](args,1);
  bVar5 = JavascriptConversion::IsCallable(pvVar9);
  if (!bVar5) goto LAB_00ba6f7b;
  pvVar9 = Arguments::operator[](args,1);
  callBackFn = VarTo<Js::RecyclableObject>(pvVar9);
  if ((*(uint *)&args->Info & 0xffffff) < 3) {
    jsReentLock._24_8_ =
         (((local_40->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         undefinedValue.ptr;
  }
  else {
    jsReentLock._24_8_ = Arguments::operator[](args,2);
  }
  if (pArr == (JavascriptArray *)0x0 && local_48 == (TypedArrayBase *)0x0) {
    bVar5 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)element);
    if (bVar5) {
      local_48 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)element);
    }
    else {
      local_48 = (TypedArrayBase *)0x0;
    }
  }
  uVar17 = (ulong)((int)length - 1);
  local_58 = (RecyclableObject *)0x0;
  if (pArr == (JavascriptArray *)0x0) {
    if (local_48 == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      local_70 = (RecyclableObject *)
                 FindObjectHelper<false,true>
                           ((RecyclableObject *)element,length,0,callBackFn,(Var)jsReentLock._24_8_,
                            local_40);
      goto LAB_00ba6f50;
    }
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2148,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) goto LAB_00ba6fa5;
      *puVar10 = 0;
    }
    bVar14 = (long)uVar17 < length;
    if (length <= (long)uVar17) goto LAB_00ba6eff;
    element = (Var)__tls_get_addr(&PTR_0155fe48);
    do {
      iVar8 = (*(local_48->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(local_48,uVar17);
      local_58 = (RecyclableObject *)CONCAT44(extraout_var,iVar8);
      if ((int)uVar17 < 0) {
        dVar4 = (double)uVar17;
        uVar11 = NumberUtilities::ToSpecial(dVar4);
        bVar5 = NumberUtilities::IsNan(dVar4);
        if (((bVar5) && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0xfff8000000000000))
           && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0x7ff8000000000000)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *(undefined4 *)element = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                      ,0xa2,
                                      "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                      ,"We should only produce a NaN with this value");
          if (!bVar5) goto LAB_00ba6fa5;
          *(undefined4 *)element = 0;
        }
        uVar16 = uVar11 ^ 0xfffc000000000000;
      }
      else {
        uVar16 = uVar17 | 0x1000000000000;
      }
      *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pTVar2 = local_40->threadContext;
      bVar5 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
      if (local_40->threadContext->noJsReentrancy == true) {
        Throw::FatalJsReentrancyError();
      }
      p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
      CheckIsExecutable(callBackFn,p_Var13);
      p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
      pvVar9 = (*p_Var13)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,
                          jsReentLock._24_8_,local_58,uVar16,local_48);
      pTVar2->reentrancySafeOrHandled = bVar5;
      JsReentLock::MutateArrayObject((JsReentLock *)local_98);
      *(bool *)((long)local_98 + 0x108) = true;
      BVar7 = JavascriptConversion::ToBoolean(pvVar9,local_40);
      if (BVar7 != 0) {
        local_70 = local_58;
        break;
      }
      uVar17 = (ulong)((int)uVar17 - 1);
      bVar14 = (long)uVar17 < length;
    } while ((long)uVar17 < length);
  }
  else {
    pRVar1 = (((local_40->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
             undefinedValue.ptr;
    if (0xffffffff < length) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2125,"(length <= 0xffffffff)","length <= UINT_MAX");
      if (!bVar5) {
LAB_00ba6fa5:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar10 = 0;
    }
    bVar14 = (long)uVar17 < length;
    if ((long)uVar17 < length) {
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      local_48 = (TypedArrayBase *)length;
      do {
        uVar15 = (int)local_48 - 1;
        *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        local_58 = pRVar1;
        local_31 = bVar14;
        (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
          super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x71])
                  (pArr,(ulong)uVar15,&local_58);
        JsReentLock::MutateArrayObject((JsReentLock *)local_98);
        *(bool *)((long)local_98 + 0x108) = true;
        if ((int)uVar15 < 0) {
          dVar4 = (double)uVar15;
          uVar11 = NumberUtilities::ToSpecial(dVar4);
          bVar5 = NumberUtilities::IsNan(dVar4);
          if (((bVar5) && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0xfff8000000000000)
              ) && (uVar12 = NumberUtilities::ToSpecial(dVar4), uVar12 != 0x7ff8000000000000)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar10 = 1;
            bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                        ,0xa2,
                                        "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                        ,"We should only produce a NaN with this value");
            if (!bVar5) goto LAB_00ba6fa5;
            *puVar10 = 0;
          }
          uVar17 = uVar11 ^ 0xfffc000000000000;
        }
        else {
          uVar17 = uVar17 | 0x1000000000000;
        }
        *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        pTVar2 = local_40->threadContext;
        bVar5 = pTVar2->reentrancySafeOrHandled;
        pTVar2->reentrancySafeOrHandled = true;
        ThreadContext::CheckAndResetReentrancySafeOrHandled(pTVar2);
        if (local_40->threadContext->noJsReentrancy == true) {
          Throw::FatalJsReentrancyError();
        }
        p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
        CheckIsExecutable(callBackFn,p_Var13);
        p_Var13 = RecyclableObject::GetEntryPoint(callBackFn);
        pvVar9 = (*p_Var13)(callBackFn,(CallInfo)callBackFn,0x2000004,0,0,0,0,0x2000004,
                            jsReentLock._24_8_,local_58,uVar17,pArr);
        pTVar2->reentrancySafeOrHandled = bVar5;
        JsReentLock::MutateArrayObject((JsReentLock *)local_98);
        *(bool *)((long)local_98 + 0x108) = true;
        BVar7 = JavascriptConversion::ToBoolean(pvVar9,local_40);
        if (BVar7 == 0) {
          bVar6 = IsNonES5Array(element);
          bVar5 = true;
          if (!bVar6) {
            bVar5 = VarIs<Js::ES5Array,Js::RecyclableObject>((RecyclableObject *)element);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar10 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x2141,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar5) goto LAB_00ba6fa5;
              *puVar10 = 0;
            }
            *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            local_70 = (RecyclableObject *)
                       FindObjectHelper<false,true>
                                 ((RecyclableObject *)element,length,(ulong)local_48 & 0xffffffff,
                                  callBackFn,(Var)jsReentLock._24_8_,local_40);
            goto LAB_00ba6c78;
          }
        }
        else {
          local_70 = local_58;
LAB_00ba6c78:
          bVar5 = false;
        }
        bVar14 = local_31;
        if (!bVar5) break;
        uVar17 = (ulong)((int)local_48 - 2);
        local_48 = (TypedArrayBase *)(ulong)uVar15;
        bVar14 = (long)uVar17 < length;
      } while ((long)uVar17 < length);
    }
    else {
LAB_00ba6eff:
      bVar14 = (long)uVar17 < length;
    }
  }
  if ((bVar14 & 1) == 0) {
    local_70 = (((local_40->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase
               ).undefinedValue.ptr;
  }
LAB_00ba6f50:
  *(undefined1 *)((long)local_98 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return local_70;
}

Assistant:

Var JavascriptArray::FindHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, int64 length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
        {
            // typedArrayBase is only non-null if and only if we came here via the TypedArray entrypoint
            if (typedArrayBase != nullptr)
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("[TypedArray].prototype.findIndex") : _u("[TypedArray].prototype.find"));
            }
            else
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, findIndex ? _u("Array.prototype.findIndex") : _u("Array.prototype.find"));
            }
        }

        RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);
        Var thisArg;

        if (args.Info.Count > 2)
        {
            thisArg = args[2];
        }
        else
        {
            thisArg = scriptContext->GetLibrary()->GetUndefined();
        }

        // If we came from Array.prototype.find/findIndex and source object is not a JavascriptArray, source could be a TypedArray
        if (typedArrayBase == nullptr && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        CallFlags flags = CallFlags_Value;
        Var element = nullptr;
        Var testResult = nullptr;
        uint32 loopStart = reversed ? (uint32)length - 1 : 0;
        int8 loopDelta = reversed ? -1 : 1;

        if (pArr)
        {
            Var undefined = scriptContext->GetLibrary()->GetUndefined();

            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k += loopDelta)
            {
                element = undefined;
                JS_REENTRANT(jsReentLock, pArr->DirectGetItemAtFull(k, &element));

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                                element,
                                index,
                                pArr);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }

                // Side-effects in the callback function may have changed the source array into an ES5Array. If this happens
                // we will process the rest of the array elements like an ES5Array.
                if (!JavascriptArray::IsNonES5Array(obj))
                {
                    AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                    JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, k + 1, callBackFn, thisArg, scriptContext));
                }
            }
        }
        else if (typedArrayBase)
        {
            Assert(length <= UINT_MAX);
            for (uint32 k = loopStart; k < length; k+= loopDelta)
            {
                // Spec does not ask to call HasItem, so we need to go to visit the whole length

                element = typedArrayBase->DirectGetItem(k);

                Var index = JavascriptNumber::ToVar(k, scriptContext);

                JS_REENTRANT(jsReentLock,
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        testResult = CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(flags, 4), thisArg,
                            element,
                            index,
                            typedArrayBase);
                    }
                    END_SAFE_REENTRANT_CALL
                );

                if (JavascriptConversion::ToBoolean(testResult, scriptContext))
                {
                    return findIndex ? index : element;
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::FindObjectHelper<findIndex, reversed>(obj, length, 0u, callBackFn, thisArg, scriptContext));
        }

        return findIndex ? JavascriptNumber::ToVar(-1, scriptContext) : scriptContext->GetLibrary()->GetUndefined();
    }